

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

void __thiscall
Centaurus::CATNNode<unsigned_char>::CATNNode(CATNNode<unsigned_char> *this,Identifier *id)

{
  pointer pwVar1;
  
  this->_vptr_CATNNode = (_func_int **)&PTR__CATNNode_001a20e8;
  (this->m_transitions).
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_submachine)._vptr_Identifier = (_func_int **)&PTR__Identifier_001a0cd8;
  (this->m_submachine).m_id._M_dataplus._M_p = (pointer)&(this->m_submachine).m_id.field_2;
  pwVar1 = (id->m_id)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&(this->m_submachine).m_id,pwVar1,pwVar1 + (id->m_id)._M_string_length);
  this->m_source = -1;
  return;
}

Assistant:

CATNNode(const Identifier& id)
        : m_submachine(id), m_source(-1)
    {
    }